

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ghosts.c
# Opt level: O0

logical pnga_update44_ghosts(Integer g_a)

{
  short sVar1;
  short sVar2;
  int iVar3;
  logical lVar4;
  size_t sVar5;
  Integer IVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long in_RDI;
  int _d_19;
  int _d_18;
  int _i_21;
  int _ndim_19;
  int _i_20;
  int _itmp_7;
  int _offset_7;
  int _ndim_18;
  int _i_19;
  int _index_15 [7];
  int _ndim_17;
  int _i_18;
  int _itmp_6;
  int _ndim_16;
  int _i_17;
  int _index_14 [7];
  int _ndim_15;
  int _i_16;
  Integer _dimpos_7;
  Integer _dimstart_7;
  Integer _dim_7;
  Integer _index_13;
  Integer _d_17;
  Integer _nb_7;
  Integer _loc_7;
  Integer _dimpos_6;
  Integer _dimstart_6;
  Integer _dim_6;
  Integer _index_12;
  Integer _d_16;
  Integer _nb_6;
  Integer _loc_6;
  Integer _hi_3 [7];
  Integer _lo_3 [7];
  Integer _offset_6;
  Integer _last_3;
  Integer _factor_3;
  Integer _d_15;
  int _ndim_14;
  int _i_15;
  int _itmp_5;
  int _offset_5;
  int _ndim_13;
  int _i_14;
  int _index_11 [7];
  int _ndim_12;
  int _i_13;
  int _itmp_4;
  int _ndim_11;
  int _i_12;
  int _index_10 [7];
  int _ndim_10;
  int _i_11;
  Integer _dimpos_5;
  Integer _dimstart_5;
  Integer _dim_5;
  Integer _index_9;
  Integer _d_14;
  Integer _nb_5;
  Integer _loc_5;
  Integer _dimpos_4;
  Integer _dimstart_4;
  Integer _dim_4;
  Integer _index_8;
  Integer _d_13;
  Integer _nb_4;
  Integer _loc_4;
  Integer _hi_2 [7];
  Integer _lo_2 [7];
  Integer _offset_4;
  Integer _last_2;
  Integer _factor_2;
  Integer _d_12;
  char err_string_3 [256];
  char *str_3;
  int _l_3;
  int _d_11;
  char err_string_2 [256];
  char *str_2;
  int _l_2;
  int _d_10;
  int _d_9;
  int _d_8;
  int _i_10;
  int _ndim_9;
  int _i_9;
  int _itmp_3;
  int _offset_3;
  int _ndim_8;
  int _i_8;
  int _index_7 [7];
  int _ndim_7;
  int _i_7;
  int _itmp_2;
  int _ndim_6;
  int _i_6;
  int _index_6 [7];
  int _ndim_5;
  int _i_5;
  Integer _dimpos_3;
  Integer _dimstart_3;
  Integer _dim_3;
  Integer _index_5;
  Integer _d_7;
  Integer _nb_3;
  Integer _loc_3;
  Integer _dimpos_2;
  Integer _dimstart_2;
  Integer _dim_2;
  Integer _index_4;
  Integer _d_6;
  Integer _nb_2;
  Integer _loc_2;
  Integer _hi_1 [7];
  Integer _lo_1 [7];
  Integer _offset_2;
  Integer _last_1;
  Integer _factor_1;
  Integer _d_5;
  int _ndim_4;
  int _i_4;
  int _itmp_1;
  int _offset_1;
  int _ndim_3;
  int _i_3;
  int _index_3 [7];
  int _ndim_2;
  int _i_2;
  int _itmp;
  int _ndim_1;
  int _i_1;
  int _index_2 [7];
  int _ndim;
  int _i;
  Integer _dimpos_1;
  Integer _dimstart_1;
  Integer _dim_1;
  Integer _index_1;
  Integer _d_4;
  Integer _nb_1;
  Integer _loc_1;
  Integer _dimpos;
  Integer _dimstart;
  Integer _dim;
  Integer _index;
  Integer _d_3;
  Integer _nb;
  Integer _loc;
  Integer _hi [7];
  Integer _lo [7];
  Integer _offset;
  Integer _last;
  Integer _factor;
  Integer _d_2;
  char err_string_1 [256];
  char *str_1;
  int _l_1;
  int _d_1;
  char err_string [256];
  char *str;
  int _l;
  int _d;
  Integer *_ga_proclist;
  Integer *_ga_map;
  Integer p_handle;
  Integer me;
  void *rcv_ptr_orig;
  void *snd_ptr_orig;
  void *rcv_ptr;
  void *snd_ptr;
  char rcv_name [32];
  char send_name [32];
  char *ptr_rcv;
  char *ptr_snd;
  int count [7];
  int stride_rcv [7];
  int stride_snd [7];
  int msglen;
  Integer ld_loc [7];
  Integer phi_rcv [7];
  Integer plo_rcv [7];
  Integer shi_rcv [7];
  Integer slo_rcv [7];
  Integer hi_rcv [7];
  Integer lo_rcv [7];
  Integer phi_snd [7];
  Integer plo_snd [7];
  Integer hi_loc [7];
  Integer lo_loc [7];
  Integer index [7];
  Integer dims [7];
  Integer width [7];
  Integer length;
  Integer msgcnt;
  Integer pmax;
  Integer proc_rem_rcv;
  Integer proc_rem_snd;
  Integer increment [7];
  Integer ndim;
  Integer bufsize;
  Integer buftot;
  Integer buflen;
  Integer size;
  Integer handle;
  Integer np;
  Integer i;
  Integer idir;
  Integer idx;
  char *in_stack_fffffffffffff030;
  Integer *in_stack_fffffffffffff038;
  Integer *in_stack_fffffffffffff040;
  long in_stack_fffffffffffff048;
  long in_stack_fffffffffffff050;
  undefined4 in_stack_fffffffffffff060;
  int in_stack_fffffffffffff064;
  int in_stack_fffffffffffff068;
  int in_stack_fffffffffffff06c;
  int in_stack_fffffffffffff070;
  int in_stack_fffffffffffff074;
  int in_stack_fffffffffffff078;
  int in_stack_fffffffffffff07c;
  int in_stack_fffffffffffff084;
  undefined4 in_stack_fffffffffffff088;
  undefined4 in_stack_fffffffffffff08c;
  int in_stack_fffffffffffff094;
  int local_f58;
  int local_f54;
  int in_stack_fffffffffffff0b0;
  int in_stack_fffffffffffff0b4;
  undefined4 in_stack_fffffffffffff0b8;
  undefined4 in_stack_fffffffffffff0bc;
  int *in_stack_fffffffffffff0c0;
  int in_stack_fffffffffffff0cc;
  void *in_stack_fffffffffffff0d0;
  int local_f1c;
  long local_f10;
  long local_f00;
  long local_ef8;
  long local_ef0;
  long local_ed8;
  long local_ec8;
  long local_ec0;
  long local_eb8;
  long local_ea8 [8];
  long local_e68 [6];
  Integer in_stack_fffffffffffff1c8;
  char *in_stack_fffffffffffff1d0;
  long local_e20;
  long local_e18;
  int local_e0c;
  int local_e08;
  int local_e04;
  int local_dfc;
  int local_df8 [6];
  undefined4 in_stack_fffffffffffff220;
  int in_stack_fffffffffffff224;
  int local_dd8;
  int local_dd4;
  int local_dcc;
  int local_dc8 [2];
  Integer *in_stack_fffffffffffff240;
  Integer in_stack_fffffffffffff248;
  Integer in_stack_fffffffffffff250;
  int local_d9c;
  long local_d90;
  long local_d80;
  long local_d78;
  long local_d70;
  long local_d58;
  long local_d48;
  long local_d40;
  long local_d38;
  long local_d28 [8];
  long local_ce8 [4];
  Integer *in_stack_fffffffffffff338;
  Integer *in_stack_fffffffffffff340;
  Integer in_stack_fffffffffffff348;
  Integer in_stack_fffffffffffff350;
  long local_ca8;
  long local_c98;
  long local_c90;
  char local_c88 [256];
  char *local_b88;
  int local_b80;
  int local_b7c;
  char local_b78 [264];
  char *local_a70;
  int local_a64;
  int local_a60;
  int local_a5c;
  int local_a58;
  int local_a54;
  int local_a50;
  int local_a4c;
  int local_a48;
  int local_a44;
  int local_a40;
  int local_a3c;
  int local_a38 [7];
  int local_a1c;
  int local_a18;
  int local_a14;
  int local_a10;
  int local_a0c;
  int local_a08 [10];
  int local_9e0;
  int local_9dc;
  long local_9d8;
  long local_9d0;
  long local_9c8;
  long local_9c0;
  long local_9b8;
  long local_9b0;
  long local_9a8;
  long local_9a0;
  long local_998;
  long local_990;
  long local_988;
  long local_980;
  long local_978;
  long local_970;
  long local_968 [8];
  long local_928 [7];
  long local_8f0;
  long local_8e8;
  long local_8e0;
  long local_8d8;
  int local_8d0;
  int local_8cc;
  int local_8c8;
  int local_8c4;
  int local_8c0;
  int local_8bc;
  int local_8b8 [7];
  int local_89c;
  int local_898;
  int local_894;
  int local_890;
  int local_88c;
  int local_888 [10];
  int local_860;
  int local_85c;
  long local_858;
  long local_850;
  long local_848;
  long local_840;
  long local_838;
  long local_830;
  long local_828;
  long local_820;
  long local_818;
  long local_810;
  long local_808;
  long local_800;
  long local_7f8;
  long local_7f0;
  long local_7e8;
  Integer *in_stack_fffffffffffff820;
  Integer *in_stack_fffffffffffff828;
  Integer *in_stack_fffffffffffff830;
  Integer *in_stack_fffffffffffff838;
  Integer *in_stack_fffffffffffff840;
  Integer in_stack_fffffffffffff848;
  long local_7a8 [8];
  long local_768;
  long local_760;
  long local_758;
  long local_750;
  char local_748 [256];
  char *local_648;
  int local_640;
  int local_63c;
  char local_638 [256];
  char *local_538;
  int local_530;
  int local_52c;
  long *local_528;
  void *local_520;
  long local_518;
  Integer local_510;
  void *local_508;
  void *local_500;
  void *local_4f8;
  void *local_4f0;
  char local_4e8 [32];
  char local_4c8 [32];
  char *local_4a8;
  char *local_4a0;
  int local_498 [8];
  int local_478 [8];
  int local_458 [8];
  long local_438 [8];
  long alStack_3f8 [8];
  long alStack_3b8 [8];
  Integer local_378 [8];
  long local_338 [8];
  long alStack_2f8 [8];
  long alStack_2b8 [8];
  long alStack_278 [8];
  Integer aIStack_238 [8];
  long local_1f8 [8];
  long local_1b8 [16];
  Integer local_138 [8];
  Integer local_f8 [7];
  long local_c0;
  long local_b8;
  long local_b0;
  long local_a8;
  long local_a0;
  long alStack_98 [7];
  long local_60;
  long local_58;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  long local_28;
  long local_20;
  long local_18;
  Integer local_10;
  logical local_8;
  
  local_38 = in_RDI + 1000;
  local_10 = in_RDI;
  local_510 = pnga_nodeid();
  local_520 = (void *)0x0;
  local_528 = (long *)0x0;
  lVar4 = pnga_has_ghosts(local_10);
  if (lVar4 == 0) {
    local_8 = 1;
  }
  else {
    local_40 = (long)GA[local_38].elemsize;
    local_60 = (long)GA[local_38].ndim;
    local_518 = (long)GA[local_38].p_handle;
    for (local_18 = 0; local_18 < local_60; local_18 = local_18 + 1) {
      alStack_98[local_18] = 0;
      local_f8[local_18] = GA[local_38].width[local_18];
      local_138[local_18] = GA[local_38].dims[local_18];
    }
    lVar4 = gai_check_ghost_distr(local_10);
    if (lVar4 == 0) {
      local_8 = 0;
    }
    else {
      local_520 = malloc((GAnproc * 0xe + 1) * 8);
      if (local_520 == (void *)0x0) {
        pnga_error(in_stack_fffffffffffff1d0,in_stack_fffffffffffff1c8);
      }
      local_528 = (long *)malloc(GAnproc << 3);
      if (local_528 == (long *)0x0) {
        pnga_error(in_stack_fffffffffffff1d0,in_stack_fffffffffffff1c8);
      }
      local_b8 = 0;
      pnga_distribution(in_stack_fffffffffffff350,in_stack_fffffffffffff348,
                        in_stack_fffffffffffff340,in_stack_fffffffffffff338);
      pnga_proc_topology(in_stack_fffffffffffff250,in_stack_fffffffffffff248,
                         in_stack_fffffffffffff240);
      local_50 = 1;
      for (local_28 = 0; local_28 < local_60; local_28 = local_28 + 1) {
        local_50 = ((local_1f8[local_28] - local_1b8[local_28]) + 1 + local_f8[local_28] * 2) *
                   local_50;
      }
      local_48 = 1;
      for (local_28 = 0; local_28 < local_60; local_28 = local_28 + 1) {
        local_20 = (local_1f8[local_28] - local_1b8[local_28]) + 1;
        if (local_48 < (local_50 / (local_20 + local_f8[local_28] * 2)) * local_f8[local_28]) {
          local_48 = (local_50 / (local_20 + local_f8[local_28] * 2)) * local_f8[local_28];
        }
      }
      local_58 = local_40 * local_48;
      strcpy(local_4c8,"send_buffer");
      strcpy(local_4e8,"receive_buffer");
      local_500 = pnga_malloc((Integer)in_stack_fffffffffffff040,
                              (int)((ulong)in_stack_fffffffffffff038 >> 0x20),
                              in_stack_fffffffffffff030);
      local_4f0 = local_500;
      local_4f8 = pnga_malloc((Integer)in_stack_fffffffffffff040,
                              (int)((ulong)in_stack_fffffffffffff038 >> 0x20),
                              in_stack_fffffffffffff030);
      local_508 = local_4f8;
      for (local_18 = 0; local_18 < local_60; local_18 = local_18 + 1) {
        if (local_f8[local_18] != 0) {
          get_remote_block_neg
                    (in_stack_fffffffffffff050,in_stack_fffffffffffff048,in_stack_fffffffffffff040,
                     in_stack_fffffffffffff038,local_f8,local_138,
                     (Integer *)CONCAT44(in_stack_fffffffffffff064,in_stack_fffffffffffff060),
                     (Integer *)CONCAT44(in_stack_fffffffffffff06c,in_stack_fffffffffffff068));
          lVar4 = pnga_locate_region(in_stack_fffffffffffff848,in_stack_fffffffffffff840,
                                     in_stack_fffffffffffff838,in_stack_fffffffffffff830,
                                     in_stack_fffffffffffff828,in_stack_fffffffffffff820);
          if (lVar4 == 0) {
            local_538 = "cannot locate region: ";
            sprintf(local_638,"%s","cannot locate region: ");
            local_52c = 0;
            sVar5 = strlen(local_538);
            local_530 = (int)sVar5;
            sprintf(local_638 + local_530,"%s",GA[local_10 + 1000].name);
            sVar5 = strlen(local_638);
            local_530 = (int)sVar5;
            sprintf(local_638 + (int)sVar5," [%ld:%ld ",local_338[local_52c],local_378[local_52c]);
            sVar5 = strlen(local_638);
            local_530 = (int)sVar5;
            local_52c = 1;
            while( true ) {
              in_stack_fffffffffffff050 = (long)local_52c;
              IVar6 = pnga_ndim(CONCAT44(in_stack_fffffffffffff224,in_stack_fffffffffffff220));
              if (IVar6 <= in_stack_fffffffffffff050) break;
              sprintf(local_638 + local_530,",%ld:%ld ",local_338[local_52c],local_378[local_52c]);
              sVar5 = strlen(local_638);
              local_530 = (int)sVar5;
              local_52c = local_52c + 1;
            }
            sprintf(local_638 + local_530,"%s","]");
            sVar5 = strlen(local_638);
            local_530 = (int)sVar5;
            pnga_error(in_stack_fffffffffffff1d0,in_stack_fffffffffffff1c8);
          }
          local_a0 = *local_528;
          if (-1 < local_518) {
            local_a0 = (long)PGRP_LIST[local_518].inv_map_proc_list[*local_528];
          }
          for (local_28 = 0; local_28 < local_60; local_28 = local_28 + 1) {
            if (local_28 == local_18) {
              alStack_2b8[local_28] = local_1f8[local_28] + 1;
              alStack_2f8[local_28] = local_1f8[local_28] + local_f8[local_28];
            }
            else {
              alStack_2b8[local_28] = local_1b8[local_28];
              alStack_2f8[local_28] = local_1f8[local_28];
            }
          }
          for (local_28 = 0; local_28 < local_60; local_28 = local_28 + 1) {
            if (local_28 == local_18) {
              if (local_138[local_28] < alStack_2f8[local_28]) {
                local_338[local_28] = 1;
                local_378[local_28] = local_f8[local_28];
              }
              else {
                local_338[local_28] = alStack_2b8[local_28];
                local_378[local_28] = alStack_2f8[local_28];
              }
            }
            else {
              local_338[local_28] = alStack_2b8[local_28];
              local_378[local_28] = alStack_2f8[local_28];
            }
          }
          lVar4 = pnga_locate_region(in_stack_fffffffffffff848,in_stack_fffffffffffff840,
                                     in_stack_fffffffffffff838,in_stack_fffffffffffff830,
                                     in_stack_fffffffffffff828,in_stack_fffffffffffff820);
          if (lVar4 == 0) {
            local_648 = "cannot locate region: ";
            sprintf(local_748,"%s","cannot locate region: ");
            local_63c = 0;
            sVar5 = strlen(local_648);
            local_640 = (int)sVar5;
            sprintf(local_748 + local_640,"%s",GA[local_10 + 1000].name);
            sVar5 = strlen(local_748);
            local_640 = (int)sVar5;
            sprintf(local_748 + (int)sVar5," [%ld:%ld ",local_338[local_63c],local_378[local_63c]);
            sVar5 = strlen(local_748);
            local_640 = (int)sVar5;
            local_63c = 1;
            while( true ) {
              in_stack_fffffffffffff048 = (long)local_63c;
              IVar6 = pnga_ndim(CONCAT44(in_stack_fffffffffffff224,in_stack_fffffffffffff220));
              if (IVar6 <= in_stack_fffffffffffff048) break;
              sprintf(local_748 + local_640,",%ld:%ld ",local_338[local_63c],local_378[local_63c]);
              sVar5 = strlen(local_748);
              local_640 = (int)sVar5;
              local_63c = local_63c + 1;
            }
            sprintf(local_748 + local_640,"%s","]");
            sVar5 = strlen(local_748);
            local_640 = (int)sVar5;
            pnga_error(in_stack_fffffffffffff1d0,in_stack_fffffffffffff1c8);
          }
          local_a8 = *local_528;
          if (-1 < local_518) {
            local_a8 = (long)PGRP_LIST[local_518].inv_map_proc_list[*local_528];
          }
          for (local_28 = 0; local_28 < local_60; local_28 = local_28 + 1) {
            if (alStack_98[local_28] == 0) {
              if (local_28 == local_18) {
                aIStack_238[local_28] = local_f8[local_28];
                alStack_278[local_28] = local_f8[local_28] * 2 + -1;
                alStack_3b8[local_28] =
                     (local_1f8[local_28] - local_1b8[local_28]) + local_f8[local_28] + 1;
                alStack_3f8[local_28] =
                     (local_1f8[local_28] - local_1b8[local_28]) + local_f8[local_28] * 2;
              }
              else {
                aIStack_238[local_28] = local_f8[local_28];
                alStack_278[local_28] =
                     (local_1f8[local_28] - local_1b8[local_28]) + local_f8[local_28];
                alStack_3b8[local_28] = local_f8[local_28];
                alStack_3f8[local_28] =
                     (local_1f8[local_28] - local_1b8[local_28]) + local_f8[local_28];
              }
            }
            else {
              alStack_3b8[local_28] = 0;
              alStack_3f8[local_28] =
                   (local_1f8[local_28] - local_1b8[local_28]) + alStack_98[local_28];
              aIStack_238[local_28] = 0;
              alStack_278[local_28] =
                   (local_1f8[local_28] - local_1b8[local_28]) + alStack_98[local_28];
            }
          }
          local_758 = 1;
          local_760 = (long)(GA[local_38].ndim + -1);
          local_768 = 0;
          if (GA[local_38].distr_type == 0) {
            if (GA[local_38].num_rstrctd == 0) {
              local_810 = (long)GA[local_38].ndim;
              local_818 = 0;
              local_7f8 = 1;
              for (local_800 = 0; local_800 < local_810; local_800 = local_800 + 1) {
                local_7f8 = GA[local_38].nblock[local_800] * local_7f8;
              }
              if ((local_7f8 + -1 < local_510) || (local_510 < 0)) {
                for (local_800 = 0; local_800 < local_810; local_800 = local_800 + 1) {
                  local_7a8[local_800] = 0;
                  (&local_7e8)[local_800] = -1;
                }
              }
              else {
                local_808 = local_510;
                for (local_800 = 0; local_800 < local_810; local_800 = local_800 + 1) {
                  local_7f0 = local_808 % (long)GA[local_38].nblock[local_800];
                  local_808 = local_808 / (long)GA[local_38].nblock[local_800];
                  local_820 = local_7f0 + local_818;
                  local_818 = GA[local_38].nblock[local_800] + local_818;
                  local_7a8[local_800] = GA[local_38].mapc[local_820];
                  if (local_7f0 == GA[local_38].nblock[local_800] + -1) {
                    (&local_7e8)[local_800] = GA[local_38].dims[local_800];
                  }
                  else {
                    (&local_7e8)[local_800] = GA[local_38].mapc[local_820 + 1] + -1;
                  }
                }
              }
            }
            else if (local_510 < GA[local_38].num_rstrctd) {
              local_848 = (long)GA[local_38].ndim;
              local_850 = 0;
              local_830 = 1;
              for (local_838 = 0; local_838 < local_848; local_838 = local_838 + 1) {
                local_830 = GA[local_38].nblock[local_838] * local_830;
              }
              if ((local_830 + -1 < local_510) || (local_510 < 0)) {
                for (local_838 = 0; local_838 < local_848; local_838 = local_838 + 1) {
                  local_7a8[local_838] = 0;
                  (&local_7e8)[local_838] = -1;
                }
              }
              else {
                local_840 = local_510;
                for (local_838 = 0; local_838 < local_848; local_838 = local_838 + 1) {
                  local_828 = local_840 % (long)GA[local_38].nblock[local_838];
                  local_840 = local_840 / (long)GA[local_38].nblock[local_838];
                  local_858 = local_828 + local_850;
                  local_850 = GA[local_38].nblock[local_838] + local_850;
                  local_7a8[local_838] = GA[local_38].mapc[local_858];
                  if (local_828 == GA[local_38].nblock[local_838] + -1) {
                    (&local_7e8)[local_838] = GA[local_38].dims[local_838];
                  }
                  else {
                    (&local_7e8)[local_838] = GA[local_38].mapc[local_858 + 1] + -1;
                  }
                }
              }
            }
            else {
              sVar2 = GA[local_38].ndim;
              local_860 = (int)sVar2;
              for (local_85c = 0; local_85c < sVar2; local_85c = local_85c + 1) {
                local_7a8[local_85c] = 0;
                (&local_7e8)[local_85c] = -1;
              }
            }
          }
          else {
            iVar3 = (int)local_510;
            if (((GA[local_38].distr_type == 1) || (GA[local_38].distr_type == 2)) ||
               (GA[local_38].distr_type == 3)) {
              sVar2 = GA[local_38].ndim;
              local_890 = (int)sVar2;
              sVar1 = GA[local_38].ndim;
              local_89c = (int)sVar1;
              local_894 = iVar3;
              local_888[0] = (int)((long)iVar3 % GA[local_38].num_blocks[0]);
              for (local_898 = 1; local_898 < sVar1; local_898 = local_898 + 1) {
                local_894 = (int)((long)(local_894 - local_888[local_898 + -1]) /
                                 GA[local_38].num_blocks[local_898 + -1]);
                local_888[local_898] = (int)((long)local_894 % GA[local_38].num_blocks[local_898]);
              }
              for (local_88c = 0; local_88c < sVar2; local_88c = local_88c + 1) {
                local_7a8[local_88c] =
                     (long)local_888[local_88c] * GA[local_38].block_dims[local_88c] + 1;
                (&local_7e8)[local_88c] =
                     (long)(local_888[local_88c] + 1) * GA[local_38].block_dims[local_88c];
                if (GA[local_38].dims[local_88c] < (&local_7e8)[local_88c]) {
                  (&local_7e8)[local_88c] = GA[local_38].dims[local_88c];
                }
              }
            }
            else if (GA[local_38].distr_type == 4) {
              sVar2 = GA[local_38].ndim;
              local_8c0 = (int)sVar2;
              local_8c4 = 0;
              sVar1 = GA[local_38].ndim;
              local_8d0 = (int)sVar1;
              local_8c8 = iVar3;
              local_8b8[0] = (int)((long)iVar3 % GA[local_38].num_blocks[0]);
              for (local_8cc = 1; local_8cc < sVar1; local_8cc = local_8cc + 1) {
                local_8c8 = (int)((long)(local_8c8 - local_8b8[local_8cc + -1]) /
                                 GA[local_38].num_blocks[local_8cc + -1]);
                local_8b8[local_8cc] = (int)((long)local_8c8 % GA[local_38].num_blocks[local_8cc]);
              }
              for (local_8bc = 0; local_8bc < sVar2; local_8bc = local_8bc + 1) {
                local_7a8[local_8bc] = GA[local_38].mapc[local_8c4 + local_8b8[local_8bc]];
                if ((long)local_8b8[local_8bc] < GA[local_38].num_blocks[local_8bc] + -1) {
                  (&local_7e8)[local_8bc] =
                       GA[local_38].mapc[local_8c4 + local_8b8[local_8bc] + 1] + -1;
                }
                else {
                  (&local_7e8)[local_8bc] = GA[local_38].dims[local_8bc];
                }
                local_8c4 = local_8c4 + (int)GA[local_38].num_blocks[local_8bc];
              }
            }
          }
          if (local_760 == 0) {
            local_438[0] = (local_7e8 - local_7a8[0]) + 1 + GA[local_38].width[0] * 2;
          }
          for (local_750 = 0; local_750 < local_760; local_750 = local_750 + 1) {
            local_768 = aIStack_238[local_750] * local_758 + local_768;
            local_438[local_750] =
                 ((&local_7e8)[local_750] - local_7a8[local_750]) + 1 +
                 GA[local_38].width[local_750] * 2;
            local_758 = local_438[local_750] * local_758;
          }
          local_768 = aIStack_238[local_760] * local_758 + local_768;
          local_4a0 = GA[local_38].ptr[local_510] + local_768 * GA[local_38].elemsize;
          local_8e0 = 1;
          local_8e8 = (long)(GA[local_38].ndim + -1);
          local_8f0 = 0;
          if (GA[local_38].distr_type == 0) {
            if (GA[local_38].num_rstrctd == 0) {
              local_990 = (long)GA[local_38].ndim;
              local_998 = 0;
              local_978 = 1;
              for (local_980 = 0; local_980 < local_990; local_980 = local_980 + 1) {
                local_978 = GA[local_38].nblock[local_980] * local_978;
              }
              if ((local_978 + -1 < local_510) || (local_510 < 0)) {
                for (local_980 = 0; local_980 < local_990; local_980 = local_980 + 1) {
                  local_928[local_980] = 0;
                  local_968[local_980] = -1;
                }
              }
              else {
                local_988 = local_510;
                for (local_980 = 0; local_980 < local_990; local_980 = local_980 + 1) {
                  local_970 = local_988 % (long)GA[local_38].nblock[local_980];
                  local_988 = local_988 / (long)GA[local_38].nblock[local_980];
                  local_9a0 = local_970 + local_998;
                  local_998 = GA[local_38].nblock[local_980] + local_998;
                  local_928[local_980] = GA[local_38].mapc[local_9a0];
                  if (local_970 == GA[local_38].nblock[local_980] + -1) {
                    local_968[local_980] = GA[local_38].dims[local_980];
                  }
                  else {
                    local_968[local_980] = GA[local_38].mapc[local_9a0 + 1] + -1;
                  }
                }
              }
            }
            else if (local_510 < GA[local_38].num_rstrctd) {
              local_9c8 = (long)GA[local_38].ndim;
              local_9d0 = 0;
              local_9b0 = 1;
              for (local_9b8 = 0; local_9b8 < local_9c8; local_9b8 = local_9b8 + 1) {
                local_9b0 = GA[local_38].nblock[local_9b8] * local_9b0;
              }
              if ((local_9b0 + -1 < local_510) || (local_510 < 0)) {
                for (local_9b8 = 0; local_9b8 < local_9c8; local_9b8 = local_9b8 + 1) {
                  local_928[local_9b8] = 0;
                  local_968[local_9b8] = -1;
                }
              }
              else {
                local_9c0 = local_510;
                for (local_9b8 = 0; local_9b8 < local_9c8; local_9b8 = local_9b8 + 1) {
                  local_9a8 = local_9c0 % (long)GA[local_38].nblock[local_9b8];
                  local_9c0 = local_9c0 / (long)GA[local_38].nblock[local_9b8];
                  local_9d8 = local_9a8 + local_9d0;
                  local_9d0 = GA[local_38].nblock[local_9b8] + local_9d0;
                  local_928[local_9b8] = GA[local_38].mapc[local_9d8];
                  if (local_9a8 == GA[local_38].nblock[local_9b8] + -1) {
                    local_968[local_9b8] = GA[local_38].dims[local_9b8];
                  }
                  else {
                    local_968[local_9b8] = GA[local_38].mapc[local_9d8 + 1] + -1;
                  }
                }
              }
            }
            else {
              sVar2 = GA[local_38].ndim;
              local_9e0 = (int)sVar2;
              for (local_9dc = 0; local_9dc < sVar2; local_9dc = local_9dc + 1) {
                local_928[local_9dc] = 0;
                local_968[local_9dc] = -1;
              }
            }
          }
          else {
            iVar3 = (int)local_510;
            if (((GA[local_38].distr_type == 1) || (GA[local_38].distr_type == 2)) ||
               (GA[local_38].distr_type == 3)) {
              sVar2 = GA[local_38].ndim;
              local_a10 = (int)sVar2;
              sVar1 = GA[local_38].ndim;
              local_a1c = (int)sVar1;
              local_a14 = iVar3;
              local_a08[0] = (int)((long)iVar3 % GA[local_38].num_blocks[0]);
              for (local_a18 = 1; local_a18 < sVar1; local_a18 = local_a18 + 1) {
                local_a14 = (int)((long)(local_a14 - local_a08[local_a18 + -1]) /
                                 GA[local_38].num_blocks[local_a18 + -1]);
                local_a08[local_a18] = (int)((long)local_a14 % GA[local_38].num_blocks[local_a18]);
              }
              for (local_a0c = 0; local_a0c < sVar2; local_a0c = local_a0c + 1) {
                local_928[local_a0c] =
                     (long)local_a08[local_a0c] * GA[local_38].block_dims[local_a0c] + 1;
                local_968[local_a0c] =
                     (long)(local_a08[local_a0c] + 1) * GA[local_38].block_dims[local_a0c];
                if (GA[local_38].dims[local_a0c] < local_968[local_a0c]) {
                  local_968[local_a0c] = GA[local_38].dims[local_a0c];
                }
              }
            }
            else if (GA[local_38].distr_type == 4) {
              sVar2 = GA[local_38].ndim;
              local_a40 = (int)sVar2;
              local_a44 = 0;
              sVar1 = GA[local_38].ndim;
              local_a50 = (int)sVar1;
              local_a48 = iVar3;
              local_a38[0] = (int)((long)iVar3 % GA[local_38].num_blocks[0]);
              for (local_a4c = 1; local_a4c < sVar1; local_a4c = local_a4c + 1) {
                local_a48 = (int)((long)(local_a48 - local_a38[local_a4c + -1]) /
                                 GA[local_38].num_blocks[local_a4c + -1]);
                local_a38[local_a4c] = (int)((long)local_a48 % GA[local_38].num_blocks[local_a4c]);
              }
              for (local_a3c = 0; local_a3c < sVar2; local_a3c = local_a3c + 1) {
                local_928[local_a3c] = GA[local_38].mapc[local_a44 + local_a38[local_a3c]];
                if ((long)local_a38[local_a3c] < GA[local_38].num_blocks[local_a3c] + -1) {
                  local_968[local_a3c] =
                       GA[local_38].mapc[local_a44 + local_a38[local_a3c] + 1] + -1;
                }
                else {
                  local_968[local_a3c] = GA[local_38].dims[local_a3c];
                }
                local_a44 = local_a44 + (int)GA[local_38].num_blocks[local_a3c];
              }
            }
          }
          if (local_8e8 == 0) {
            local_438[0] = (local_968[0] - local_928[0]) + 1 + GA[local_38].width[0] * 2;
          }
          for (local_8d8 = 0; local_8d8 < local_8e8; local_8d8 = local_8d8 + 1) {
            local_8f0 = alStack_3b8[local_8d8] * local_8e0 + local_8f0;
            local_438[local_8d8] =
                 (local_968[local_8d8] - local_928[local_8d8]) + 1 +
                 GA[local_38].width[local_8d8] * 2;
            local_8e0 = local_438[local_8d8] * local_8e0;
          }
          local_8f0 = alStack_3b8[local_8e8] * local_8e0 + local_8f0;
          local_4a8 = GA[local_38].ptr[local_510] + local_8f0 * GA[local_38].elemsize;
          local_458[0] = (int)local_40;
          local_478[0] = (int)local_40;
          for (local_a54 = 0; (long)local_a54 < local_60 + -1; local_a54 = local_a54 + 1) {
            local_478[local_a54] = (int)local_438[local_a54] * local_478[local_a54];
            local_458[local_a54] = (int)local_438[local_a54] * local_458[local_a54];
            local_478[local_a54 + 1] = local_478[local_a54];
            local_458[local_a54 + 1] = local_458[local_a54];
          }
          for (local_a58 = 0; local_a58 < local_60; local_a58 = local_a58 + 1) {
            local_498[local_a58] = ((int)alStack_3f8[local_a58] - (int)alStack_3b8[local_a58]) + 1;
          }
          local_c0 = 1;
          for (local_a5c = 0; local_a5c < local_60; local_a5c = local_a5c + 1) {
            local_c0 = ((alStack_278[local_a5c] - aIStack_238[local_a5c]) + 1) * local_c0;
          }
          local_c0 = local_40 * local_c0;
          local_498[0] = local_498[0] * (int)local_40;
          armci_write_strided(in_stack_fffffffffffff0d0,in_stack_fffffffffffff0cc,
                              in_stack_fffffffffffff0c0,
                              (int *)CONCAT44(in_stack_fffffffffffff0bc,in_stack_fffffffffffff0b8),
                              (char *)CONCAT44(in_stack_fffffffffffff0b4,in_stack_fffffffffffff0b0))
          ;
          local_4f0 = local_500;
          local_4f8 = local_508;
          if (GAme == local_a0) {
            local_4f8 = local_500;
          }
          else if (GA[local_38].nblock[local_18] % 2 == 0) {
            if (local_138[local_18 + -8] % 2 == 0) {
              armci_msg_rcv(in_stack_fffffffffffff094,
                            (void *)CONCAT44(in_stack_fffffffffffff08c,in_stack_fffffffffffff088),
                            in_stack_fffffffffffff084,
                            (int *)CONCAT44(in_stack_fffffffffffff07c,in_stack_fffffffffffff078),
                            in_stack_fffffffffffff074);
            }
            else {
              armci_msg_snd(in_stack_fffffffffffff084,
                            (void *)CONCAT44(in_stack_fffffffffffff07c,in_stack_fffffffffffff078),
                            in_stack_fffffffffffff074,in_stack_fffffffffffff070);
            }
            if (local_138[local_18 + -8] % 2 == 0) {
              armci_msg_snd(in_stack_fffffffffffff084,
                            (void *)CONCAT44(in_stack_fffffffffffff07c,in_stack_fffffffffffff078),
                            in_stack_fffffffffffff074,in_stack_fffffffffffff070);
            }
            else {
              armci_msg_rcv(in_stack_fffffffffffff094,
                            (void *)CONCAT44(in_stack_fffffffffffff08c,in_stack_fffffffffffff088),
                            in_stack_fffffffffffff084,
                            (int *)CONCAT44(in_stack_fffffffffffff07c,in_stack_fffffffffffff078),
                            in_stack_fffffffffffff074);
            }
          }
          else {
            local_b0 = (long)(GA[local_38].nblock[local_18] + -1);
            if (local_138[local_18 + -8] % 2 == 0) {
              if (local_138[local_18 + -8] != local_b0) {
                armci_msg_rcv(in_stack_fffffffffffff094,
                              (void *)CONCAT44(in_stack_fffffffffffff08c,in_stack_fffffffffffff088),
                              in_stack_fffffffffffff084,
                              (int *)CONCAT44(in_stack_fffffffffffff07c,in_stack_fffffffffffff078),
                              in_stack_fffffffffffff074);
              }
            }
            else {
              armci_msg_snd(in_stack_fffffffffffff084,
                            (void *)CONCAT44(in_stack_fffffffffffff07c,in_stack_fffffffffffff078),
                            in_stack_fffffffffffff074,in_stack_fffffffffffff070);
            }
            if (local_138[local_18 + -8] % 2 == 0) {
              if (local_138[local_18 + -8] != 0) {
                armci_msg_snd(in_stack_fffffffffffff084,
                              (void *)CONCAT44(in_stack_fffffffffffff07c,in_stack_fffffffffffff078),
                              in_stack_fffffffffffff074,in_stack_fffffffffffff070);
              }
            }
            else {
              armci_msg_rcv(in_stack_fffffffffffff094,
                            (void *)CONCAT44(in_stack_fffffffffffff08c,in_stack_fffffffffffff088),
                            in_stack_fffffffffffff084,
                            (int *)CONCAT44(in_stack_fffffffffffff07c,in_stack_fffffffffffff078),
                            in_stack_fffffffffffff074);
            }
            if (local_138[local_18 + -8] == 0) {
              armci_msg_snd(in_stack_fffffffffffff084,
                            (void *)CONCAT44(in_stack_fffffffffffff07c,in_stack_fffffffffffff078),
                            in_stack_fffffffffffff074,in_stack_fffffffffffff070);
            }
            if (local_138[local_18 + -8] == local_b0) {
              armci_msg_rcv(in_stack_fffffffffffff094,
                            (void *)CONCAT44(in_stack_fffffffffffff08c,in_stack_fffffffffffff088),
                            in_stack_fffffffffffff084,
                            (int *)CONCAT44(in_stack_fffffffffffff07c,in_stack_fffffffffffff078),
                            in_stack_fffffffffffff074);
            }
          }
          local_b8 = local_b8 + 1;
          armci_read_strided(in_stack_fffffffffffff0d0,in_stack_fffffffffffff0cc,
                             in_stack_fffffffffffff0c0,
                             (int *)CONCAT44(in_stack_fffffffffffff0bc,in_stack_fffffffffffff0b8),
                             (char *)CONCAT44(in_stack_fffffffffffff0b4,in_stack_fffffffffffff0b0));
          get_remote_block_pos
                    (in_stack_fffffffffffff050,in_stack_fffffffffffff048,in_stack_fffffffffffff040,
                     in_stack_fffffffffffff038,local_f8,local_138,
                     (Integer *)CONCAT44(in_stack_fffffffffffff064,in_stack_fffffffffffff060),
                     (Integer *)CONCAT44(in_stack_fffffffffffff06c,in_stack_fffffffffffff068));
          lVar4 = pnga_locate_region(in_stack_fffffffffffff848,in_stack_fffffffffffff840,
                                     in_stack_fffffffffffff838,in_stack_fffffffffffff830,
                                     in_stack_fffffffffffff828,in_stack_fffffffffffff820);
          if (lVar4 == 0) {
            local_a70 = "cannot locate region: ";
            sprintf(local_b78,"%s","cannot locate region: ");
            local_a60 = 0;
            sVar5 = strlen(local_a70);
            local_a64 = (int)sVar5;
            sprintf(local_b78 + local_a64,"%s",GA[local_10 + 1000].name);
            sVar5 = strlen(local_b78);
            local_a64 = (int)sVar5;
            sprintf(local_b78 + (int)sVar5," [%ld:%ld ",local_338[local_a60],local_378[local_a60]);
            sVar5 = strlen(local_b78);
            local_a64 = (int)sVar5;
            local_a60 = 1;
            while( true ) {
              in_stack_fffffffffffff040 = (Integer *)(long)local_a60;
              IVar6 = pnga_ndim(CONCAT44(in_stack_fffffffffffff224,in_stack_fffffffffffff220));
              if (IVar6 <= (long)in_stack_fffffffffffff040) break;
              sprintf(local_b78 + local_a64,",%ld:%ld ",local_338[local_a60],local_378[local_a60]);
              sVar5 = strlen(local_b78);
              local_a64 = (int)sVar5;
              local_a60 = local_a60 + 1;
            }
            sprintf(local_b78 + local_a64,"%s","]");
            sVar5 = strlen(local_b78);
            local_a64 = (int)sVar5;
            pnga_error(in_stack_fffffffffffff1d0,in_stack_fffffffffffff1c8);
          }
          local_a0 = *local_528;
          if (-1 < local_518) {
            local_a0 = (long)PGRP_LIST[local_518].inv_map_proc_list[*local_528];
          }
          for (local_28 = 0; local_28 < local_60; local_28 = local_28 + 1) {
            if (local_28 == local_18) {
              alStack_2b8[local_28] = local_1b8[local_28] - local_f8[local_28];
              alStack_2f8[local_28] = local_1b8[local_28] + -1;
            }
            else {
              alStack_2b8[local_28] = local_1b8[local_28];
              alStack_2f8[local_28] = local_1f8[local_28];
            }
          }
          for (local_28 = 0; local_28 < local_60; local_28 = local_28 + 1) {
            if (local_28 == local_18) {
              if (alStack_2f8[local_28] < 1) {
                local_338[local_28] = (local_138[local_28] - local_f8[local_28]) + 1;
                local_378[local_28] = local_138[local_28];
              }
              else {
                local_338[local_28] = alStack_2b8[local_28];
                local_378[local_28] = alStack_2f8[local_28];
              }
            }
            else {
              local_338[local_28] = alStack_2b8[local_28];
              local_378[local_28] = alStack_2f8[local_28];
            }
          }
          lVar4 = pnga_locate_region(in_stack_fffffffffffff848,in_stack_fffffffffffff840,
                                     in_stack_fffffffffffff838,in_stack_fffffffffffff830,
                                     in_stack_fffffffffffff828,in_stack_fffffffffffff820);
          if (lVar4 == 0) {
            local_b88 = "cannot locate region: ";
            sprintf(local_c88,"%s","cannot locate region: ");
            local_b7c = 0;
            sVar5 = strlen(local_b88);
            local_b80 = (int)sVar5;
            sprintf(local_c88 + local_b80,"%s",GA[local_10 + 1000].name);
            sVar5 = strlen(local_c88);
            local_b80 = (int)sVar5;
            sprintf(local_c88 + (int)sVar5," [%ld:%ld ",local_338[local_b7c],local_378[local_b7c]);
            sVar5 = strlen(local_c88);
            local_b80 = (int)sVar5;
            local_b7c = 1;
            while( true ) {
              in_stack_fffffffffffff038 = (Integer *)(long)local_b7c;
              IVar6 = pnga_ndim(CONCAT44(in_stack_fffffffffffff224,in_stack_fffffffffffff220));
              if (IVar6 <= (long)in_stack_fffffffffffff038) break;
              sprintf(local_c88 + local_b80,",%ld:%ld ",local_338[local_b7c],local_378[local_b7c]);
              sVar5 = strlen(local_c88);
              local_b80 = (int)sVar5;
              local_b7c = local_b7c + 1;
            }
            sprintf(local_c88 + local_b80,"%s","]");
            sVar5 = strlen(local_c88);
            local_b80 = (int)sVar5;
            pnga_error(in_stack_fffffffffffff1d0,in_stack_fffffffffffff1c8);
          }
          local_a8 = *local_528;
          if (-1 < local_518) {
            local_a8 = (long)PGRP_LIST[local_518].inv_map_proc_list[*local_528];
          }
          for (local_28 = 0; local_28 < local_60; local_28 = local_28 + 1) {
            if (alStack_98[local_28] == 0) {
              if (local_28 == local_18) {
                aIStack_238[local_28] = (local_1f8[local_28] - local_1b8[local_28]) + 1;
                alStack_278[local_28] =
                     (local_1f8[local_28] - local_1b8[local_28]) + local_f8[local_28];
                alStack_3b8[local_28] = 0;
                alStack_3f8[local_28] = local_f8[local_28] + -1;
              }
              else {
                aIStack_238[local_28] = local_f8[local_28];
                alStack_278[local_28] =
                     (local_1f8[local_28] - local_1b8[local_28]) + local_f8[local_28];
                alStack_3b8[local_28] = local_f8[local_28];
                alStack_3f8[local_28] =
                     (local_1f8[local_28] - local_1b8[local_28]) + local_f8[local_28];
              }
            }
            else {
              alStack_3b8[local_28] = 0;
              alStack_3f8[local_28] =
                   (local_1f8[local_28] - local_1b8[local_28]) + alStack_98[local_28];
              aIStack_238[local_28] = 0;
              alStack_278[local_28] =
                   (local_1f8[local_28] - local_1b8[local_28]) + alStack_98[local_28];
            }
          }
          local_c98 = 1;
          lVar7 = (long)(GA[local_38].ndim + -1);
          local_ca8 = 0;
          if (GA[local_38].distr_type == 0) {
            if (GA[local_38].num_rstrctd == 0) {
              lVar8 = (long)GA[local_38].ndim;
              local_d58 = 0;
              local_d38 = 1;
              for (local_d40 = 0; local_d40 < lVar8; local_d40 = local_d40 + 1) {
                local_d38 = GA[local_38].nblock[local_d40] * local_d38;
              }
              if ((local_d38 + -1 < local_510) || (local_510 < 0)) {
                for (local_d40 = 0; local_d40 < lVar8; local_d40 = local_d40 + 1) {
                  local_ce8[local_d40] = 0;
                  local_d28[local_d40] = -1;
                }
              }
              else {
                local_d48 = local_510;
                for (local_d40 = 0; local_d40 < lVar8; local_d40 = local_d40 + 1) {
                  lVar10 = local_d48 % (long)GA[local_38].nblock[local_d40];
                  local_d48 = local_d48 / (long)GA[local_38].nblock[local_d40];
                  lVar9 = lVar10 + local_d58;
                  local_d58 = GA[local_38].nblock[local_d40] + local_d58;
                  local_ce8[local_d40] = GA[local_38].mapc[lVar9];
                  if (lVar10 == GA[local_38].nblock[local_d40] + -1) {
                    local_d28[local_d40] = GA[local_38].dims[local_d40];
                  }
                  else {
                    local_d28[local_d40] = GA[local_38].mapc[lVar9 + 1] + -1;
                  }
                }
              }
            }
            else if (local_510 < GA[local_38].num_rstrctd) {
              lVar8 = (long)GA[local_38].ndim;
              local_d90 = 0;
              local_d70 = 1;
              for (local_d78 = 0; local_d78 < lVar8; local_d78 = local_d78 + 1) {
                local_d70 = GA[local_38].nblock[local_d78] * local_d70;
              }
              if ((local_d70 + -1 < local_510) || (local_510 < 0)) {
                for (local_d78 = 0; local_d78 < lVar8; local_d78 = local_d78 + 1) {
                  local_ce8[local_d78] = 0;
                  local_d28[local_d78] = -1;
                }
              }
              else {
                local_d80 = local_510;
                for (local_d78 = 0; local_d78 < lVar8; local_d78 = local_d78 + 1) {
                  lVar10 = local_d80 % (long)GA[local_38].nblock[local_d78];
                  local_d80 = local_d80 / (long)GA[local_38].nblock[local_d78];
                  lVar9 = lVar10 + local_d90;
                  local_d90 = GA[local_38].nblock[local_d78] + local_d90;
                  local_ce8[local_d78] = GA[local_38].mapc[lVar9];
                  if (lVar10 == GA[local_38].nblock[local_d78] + -1) {
                    local_d28[local_d78] = GA[local_38].dims[local_d78];
                  }
                  else {
                    local_d28[local_d78] = GA[local_38].mapc[lVar9 + 1] + -1;
                  }
                }
              }
            }
            else {
              sVar2 = GA[local_38].ndim;
              for (local_d9c = 0; local_d9c < sVar2; local_d9c = local_d9c + 1) {
                local_ce8[local_d9c] = 0;
                local_d28[local_d9c] = -1;
              }
            }
          }
          else {
            local_e08 = (int)local_510;
            if (((GA[local_38].distr_type == 1) || (GA[local_38].distr_type == 2)) ||
               (GA[local_38].distr_type == 3)) {
              sVar2 = GA[local_38].ndim;
              in_stack_fffffffffffff224 = (int)GA[local_38].ndim;
              local_dc8[0] = (int)((long)local_e08 % GA[local_38].num_blocks[0]);
              local_dd4 = local_e08;
              for (local_dd8 = 1; local_dd8 < in_stack_fffffffffffff224; local_dd8 = local_dd8 + 1)
              {
                local_dd4 = (int)((long)(local_dd4 - local_dc8[local_dd8 + -1]) /
                                 GA[local_38].num_blocks[local_dd8 + -1]);
                local_dc8[local_dd8] = (int)((long)local_dd4 % GA[local_38].num_blocks[local_dd8]);
              }
              for (local_dcc = 0; local_dcc < sVar2; local_dcc = local_dcc + 1) {
                local_ce8[local_dcc] =
                     (long)local_dc8[local_dcc] * GA[local_38].block_dims[local_dcc] + 1;
                local_d28[local_dcc] =
                     (long)(local_dc8[local_dcc] + 1) * GA[local_38].block_dims[local_dcc];
                if (GA[local_38].dims[local_dcc] < local_d28[local_dcc]) {
                  local_d28[local_dcc] = GA[local_38].dims[local_dcc];
                }
              }
            }
            else if (GA[local_38].distr_type == 4) {
              sVar2 = GA[local_38].ndim;
              local_e04 = 0;
              sVar1 = GA[local_38].ndim;
              local_df8[0] = (int)((long)local_e08 % GA[local_38].num_blocks[0]);
              for (local_e0c = 1; local_e0c < sVar1; local_e0c = local_e0c + 1) {
                local_e08 = (int)((long)(local_e08 - local_df8[local_e0c + -1]) /
                                 GA[local_38].num_blocks[local_e0c + -1]);
                local_df8[local_e0c] = (int)((long)local_e08 % GA[local_38].num_blocks[local_e0c]);
              }
              for (local_dfc = 0; local_dfc < sVar2; local_dfc = local_dfc + 1) {
                local_ce8[local_dfc] = GA[local_38].mapc[local_e04 + local_df8[local_dfc]];
                if ((long)local_df8[local_dfc] < GA[local_38].num_blocks[local_dfc] + -1) {
                  local_d28[local_dfc] =
                       GA[local_38].mapc[local_e04 + local_df8[local_dfc] + 1] + -1;
                }
                else {
                  local_d28[local_dfc] = GA[local_38].dims[local_dfc];
                }
                local_e04 = local_e04 + (int)GA[local_38].num_blocks[local_dfc];
              }
            }
          }
          if (lVar7 == 0) {
            local_438[0] = (local_d28[0] - local_ce8[0]) + 1 + GA[local_38].width[0] * 2;
          }
          for (local_c90 = 0; local_c90 < lVar7; local_c90 = local_c90 + 1) {
            local_ca8 = aIStack_238[local_c90] * local_c98 + local_ca8;
            local_438[local_c90] =
                 (local_d28[local_c90] - local_ce8[local_c90]) + 1 +
                 GA[local_38].width[local_c90] * 2;
            local_c98 = local_438[local_c90] * local_c98;
          }
          local_4a0 = GA[local_38].ptr[local_510] +
                      (aIStack_238[lVar7] * local_c98 + local_ca8) * (long)GA[local_38].elemsize;
          local_e20 = 1;
          lVar7 = (long)(GA[local_38].ndim + -1);
          lVar8 = 0;
          if (GA[local_38].distr_type == 0) {
            if (GA[local_38].num_rstrctd == 0) {
              lVar9 = (long)GA[local_38].ndim;
              local_ed8 = 0;
              local_eb8 = 1;
              for (local_ec0 = 0; local_ec0 < lVar9; local_ec0 = local_ec0 + 1) {
                local_eb8 = GA[local_38].nblock[local_ec0] * local_eb8;
              }
              if ((local_eb8 + -1 < local_510) || (local_510 < 0)) {
                for (local_ec0 = 0; local_ec0 < lVar9; local_ec0 = local_ec0 + 1) {
                  local_e68[local_ec0] = 0;
                  local_ea8[local_ec0] = -1;
                }
              }
              else {
                local_ec8 = local_510;
                for (local_ec0 = 0; local_ec0 < lVar9; local_ec0 = local_ec0 + 1) {
                  lVar11 = local_ec8 % (long)GA[local_38].nblock[local_ec0];
                  local_ec8 = local_ec8 / (long)GA[local_38].nblock[local_ec0];
                  lVar10 = lVar11 + local_ed8;
                  local_ed8 = GA[local_38].nblock[local_ec0] + local_ed8;
                  local_e68[local_ec0] = GA[local_38].mapc[lVar10];
                  if (lVar11 == GA[local_38].nblock[local_ec0] + -1) {
                    local_ea8[local_ec0] = GA[local_38].dims[local_ec0];
                  }
                  else {
                    local_ea8[local_ec0] = GA[local_38].mapc[lVar10 + 1] + -1;
                  }
                }
              }
            }
            else if (local_510 < GA[local_38].num_rstrctd) {
              lVar9 = (long)GA[local_38].ndim;
              local_f10 = 0;
              local_ef0 = 1;
              for (local_ef8 = 0; local_ef8 < lVar9; local_ef8 = local_ef8 + 1) {
                local_ef0 = GA[local_38].nblock[local_ef8] * local_ef0;
              }
              if ((local_ef0 + -1 < local_510) || (local_510 < 0)) {
                for (local_ef8 = 0; local_ef8 < lVar9; local_ef8 = local_ef8 + 1) {
                  local_e68[local_ef8] = 0;
                  local_ea8[local_ef8] = -1;
                }
              }
              else {
                local_f00 = local_510;
                for (local_ef8 = 0; local_ef8 < lVar9; local_ef8 = local_ef8 + 1) {
                  lVar11 = local_f00 % (long)GA[local_38].nblock[local_ef8];
                  local_f00 = local_f00 / (long)GA[local_38].nblock[local_ef8];
                  lVar10 = lVar11 + local_f10;
                  local_f10 = GA[local_38].nblock[local_ef8] + local_f10;
                  local_e68[local_ef8] = GA[local_38].mapc[lVar10];
                  if (lVar11 == GA[local_38].nblock[local_ef8] + -1) {
                    local_ea8[local_ef8] = GA[local_38].dims[local_ef8];
                  }
                  else {
                    local_ea8[local_ef8] = GA[local_38].mapc[lVar10 + 1] + -1;
                  }
                }
              }
            }
            else {
              sVar2 = GA[local_38].ndim;
              for (local_f1c = 0; local_f1c < sVar2; local_f1c = local_f1c + 1) {
                local_e68[local_f1c] = 0;
                local_ea8[local_f1c] = -1;
              }
            }
          }
          else {
            local_f54 = (int)local_510;
            if (((GA[local_38].distr_type == 1) || (GA[local_38].distr_type == 2)) ||
               (GA[local_38].distr_type == 3)) {
              in_stack_fffffffffffff0b0 = (int)GA[local_38].ndim;
              sVar2 = GA[local_38].ndim;
              in_stack_fffffffffffff0b8 = (undefined4)((long)local_f54 % GA[local_38].num_blocks[0])
              ;
              for (local_f58 = 1; local_f58 < sVar2; local_f58 = local_f58 + 1) {
                local_f54 = (int)((long)(local_f54 -
                                        *(int *)(&stack0xfffffffffffff0b8 +
                                                (long)(local_f58 + -1) * 4)) /
                                 GA[local_38].num_blocks[local_f58 + -1]);
                *(int *)(&stack0xfffffffffffff0b8 + (long)local_f58 * 4) =
                     (int)((long)local_f54 % GA[local_38].num_blocks[local_f58]);
              }
              for (in_stack_fffffffffffff0b4 = 0;
                  in_stack_fffffffffffff0b4 < in_stack_fffffffffffff0b0;
                  in_stack_fffffffffffff0b4 = in_stack_fffffffffffff0b4 + 1) {
                local_e68[in_stack_fffffffffffff0b4] =
                     (long)*(int *)(&stack0xfffffffffffff0b8 + (long)in_stack_fffffffffffff0b4 * 4)
                     * GA[local_38].block_dims[in_stack_fffffffffffff0b4] + 1;
                local_ea8[in_stack_fffffffffffff0b4] =
                     (long)(*(int *)(&stack0xfffffffffffff0b8 + (long)in_stack_fffffffffffff0b4 * 4)
                           + 1) * GA[local_38].block_dims[in_stack_fffffffffffff0b4];
                if (GA[local_38].dims[in_stack_fffffffffffff0b4] <
                    local_ea8[in_stack_fffffffffffff0b4]) {
                  local_ea8[in_stack_fffffffffffff0b4] =
                       GA[local_38].dims[in_stack_fffffffffffff0b4];
                }
              }
            }
            else if (GA[local_38].distr_type == 4) {
              sVar2 = GA[local_38].ndim;
              in_stack_fffffffffffff07c = 0;
              in_stack_fffffffffffff070 = (int)GA[local_38].ndim;
              in_stack_fffffffffffff088 = (undefined4)((long)local_f54 % GA[local_38].num_blocks[0])
              ;
              for (in_stack_fffffffffffff074 = 1;
                  in_stack_fffffffffffff074 < in_stack_fffffffffffff070;
                  in_stack_fffffffffffff074 = in_stack_fffffffffffff074 + 1) {
                local_f54 = (int)((long)(local_f54 -
                                        *(int *)(&stack0xfffffffffffff088 +
                                                (long)(in_stack_fffffffffffff074 + -1) * 4)) /
                                 GA[local_38].num_blocks[in_stack_fffffffffffff074 + -1]);
                *(int *)(&stack0xfffffffffffff088 + (long)in_stack_fffffffffffff074 * 4) =
                     (int)((long)local_f54 % GA[local_38].num_blocks[in_stack_fffffffffffff074]);
              }
              for (in_stack_fffffffffffff084 = 0; in_stack_fffffffffffff078 = local_f54,
                  in_stack_fffffffffffff084 < sVar2;
                  in_stack_fffffffffffff084 = in_stack_fffffffffffff084 + 1) {
                local_e68[in_stack_fffffffffffff084] =
                     GA[local_38].mapc
                     [in_stack_fffffffffffff07c +
                      *(int *)(&stack0xfffffffffffff088 + (long)in_stack_fffffffffffff084 * 4)];
                if ((long)*(int *)(&stack0xfffffffffffff088 + (long)in_stack_fffffffffffff084 * 4) <
                    GA[local_38].num_blocks[in_stack_fffffffffffff084] + -1) {
                  local_ea8[in_stack_fffffffffffff084] =
                       GA[local_38].mapc
                       [in_stack_fffffffffffff07c +
                        *(int *)(&stack0xfffffffffffff088 + (long)in_stack_fffffffffffff084 * 4) + 1
                       ] + -1;
                }
                else {
                  local_ea8[in_stack_fffffffffffff084] =
                       GA[local_38].dims[in_stack_fffffffffffff084];
                }
                in_stack_fffffffffffff07c =
                     in_stack_fffffffffffff07c +
                     (int)GA[local_38].num_blocks[in_stack_fffffffffffff084];
              }
            }
          }
          if (lVar7 == 0) {
            local_438[0] = (local_ea8[0] - local_e68[0]) + 1 + GA[local_38].width[0] * 2;
          }
          for (local_e18 = 0; local_e18 < lVar7; local_e18 = local_e18 + 1) {
            lVar8 = alStack_3b8[local_e18] * local_e20 + lVar8;
            local_438[local_e18] =
                 (local_ea8[local_e18] - local_e68[local_e18]) + 1 +
                 GA[local_38].width[local_e18] * 2;
            local_e20 = local_438[local_e18] * local_e20;
          }
          in_stack_fffffffffffff1d0 = (char *)(alStack_3b8[lVar7] * local_e20 + lVar8);
          local_4a8 = GA[local_38].ptr[local_510] +
                      (long)in_stack_fffffffffffff1d0 * (long)GA[local_38].elemsize;
          local_458[0] = (int)local_40;
          local_478[0] = (int)local_40;
          for (in_stack_fffffffffffff06c = 0; (long)in_stack_fffffffffffff06c < local_60 + -1;
              in_stack_fffffffffffff06c = in_stack_fffffffffffff06c + 1) {
            local_478[in_stack_fffffffffffff06c] =
                 (int)local_438[in_stack_fffffffffffff06c] * local_478[in_stack_fffffffffffff06c];
            local_458[in_stack_fffffffffffff06c] =
                 (int)local_438[in_stack_fffffffffffff06c] * local_458[in_stack_fffffffffffff06c];
            local_478[in_stack_fffffffffffff06c + 1] = local_478[in_stack_fffffffffffff06c];
            local_458[in_stack_fffffffffffff06c + 1] = local_458[in_stack_fffffffffffff06c];
          }
          for (in_stack_fffffffffffff068 = 0; in_stack_fffffffffffff068 < local_60;
              in_stack_fffffffffffff068 = in_stack_fffffffffffff068 + 1) {
            local_498[in_stack_fffffffffffff068] =
                 ((int)alStack_3f8[in_stack_fffffffffffff068] -
                 (int)alStack_3b8[in_stack_fffffffffffff068]) + 1;
          }
          local_c0 = 1;
          for (in_stack_fffffffffffff064 = 0; in_stack_fffffffffffff064 < local_60;
              in_stack_fffffffffffff064 = in_stack_fffffffffffff064 + 1) {
            local_c0 = ((alStack_278[in_stack_fffffffffffff064] -
                        aIStack_238[in_stack_fffffffffffff064]) + 1) * local_c0;
          }
          local_c0 = local_40 * local_c0;
          local_498[0] = local_498[0] * (int)local_40;
          armci_write_strided(in_stack_fffffffffffff0d0,in_stack_fffffffffffff0cc,
                              in_stack_fffffffffffff0c0,
                              (int *)CONCAT44(in_stack_fffffffffffff0bc,in_stack_fffffffffffff0b8),
                              (char *)CONCAT44(in_stack_fffffffffffff0b4,in_stack_fffffffffffff0b0))
          ;
          local_4f0 = local_500;
          local_4f8 = local_508;
          if (GAme == local_a8) {
            local_4f8 = local_500;
          }
          else if (GA[local_38].nblock[local_18] % 2 == 0) {
            if (local_138[local_18 + -8] % 2 == 0) {
              armci_msg_rcv(in_stack_fffffffffffff094,
                            (void *)CONCAT44(in_stack_fffffffffffff08c,in_stack_fffffffffffff088),
                            in_stack_fffffffffffff084,
                            (int *)CONCAT44(in_stack_fffffffffffff07c,in_stack_fffffffffffff078),
                            in_stack_fffffffffffff074);
            }
            else {
              armci_msg_snd(in_stack_fffffffffffff084,
                            (void *)CONCAT44(in_stack_fffffffffffff07c,in_stack_fffffffffffff078),
                            in_stack_fffffffffffff074,in_stack_fffffffffffff070);
            }
            if (local_138[local_18 + -8] % 2 == 0) {
              armci_msg_snd(in_stack_fffffffffffff084,
                            (void *)CONCAT44(in_stack_fffffffffffff07c,in_stack_fffffffffffff078),
                            in_stack_fffffffffffff074,in_stack_fffffffffffff070);
            }
            else {
              armci_msg_rcv(in_stack_fffffffffffff094,
                            (void *)CONCAT44(in_stack_fffffffffffff08c,in_stack_fffffffffffff088),
                            in_stack_fffffffffffff084,
                            (int *)CONCAT44(in_stack_fffffffffffff07c,in_stack_fffffffffffff078),
                            in_stack_fffffffffffff074);
            }
          }
          else {
            local_b0 = (long)(GA[local_38].nblock[local_18] + -1);
            if (local_138[local_18 + -8] % 2 == 0) {
              if (local_138[local_18 + -8] != 0) {
                armci_msg_rcv(in_stack_fffffffffffff094,
                              (void *)CONCAT44(in_stack_fffffffffffff08c,in_stack_fffffffffffff088),
                              in_stack_fffffffffffff084,
                              (int *)CONCAT44(in_stack_fffffffffffff07c,in_stack_fffffffffffff078),
                              in_stack_fffffffffffff074);
              }
            }
            else {
              armci_msg_snd(in_stack_fffffffffffff084,
                            (void *)CONCAT44(in_stack_fffffffffffff07c,in_stack_fffffffffffff078),
                            in_stack_fffffffffffff074,in_stack_fffffffffffff070);
            }
            if (local_138[local_18 + -8] % 2 == 0) {
              if (local_138[local_18 + -8] != local_b0) {
                armci_msg_snd(in_stack_fffffffffffff084,
                              (void *)CONCAT44(in_stack_fffffffffffff07c,in_stack_fffffffffffff078),
                              in_stack_fffffffffffff074,in_stack_fffffffffffff070);
              }
            }
            else {
              armci_msg_rcv(in_stack_fffffffffffff094,
                            (void *)CONCAT44(in_stack_fffffffffffff08c,in_stack_fffffffffffff088),
                            in_stack_fffffffffffff084,
                            (int *)CONCAT44(in_stack_fffffffffffff07c,in_stack_fffffffffffff078),
                            in_stack_fffffffffffff074);
            }
            if (local_138[local_18 + -8] == local_b0) {
              armci_msg_snd(in_stack_fffffffffffff084,
                            (void *)CONCAT44(in_stack_fffffffffffff07c,in_stack_fffffffffffff078),
                            in_stack_fffffffffffff074,in_stack_fffffffffffff070);
            }
            if (local_138[local_18 + -8] == 0) {
              armci_msg_rcv(in_stack_fffffffffffff094,
                            (void *)CONCAT44(in_stack_fffffffffffff08c,in_stack_fffffffffffff088),
                            in_stack_fffffffffffff084,
                            (int *)CONCAT44(in_stack_fffffffffffff07c,in_stack_fffffffffffff078),
                            in_stack_fffffffffffff074);
            }
          }
          armci_read_strided(in_stack_fffffffffffff0d0,in_stack_fffffffffffff0cc,
                             in_stack_fffffffffffff0c0,
                             (int *)CONCAT44(in_stack_fffffffffffff0bc,in_stack_fffffffffffff0b8),
                             (char *)CONCAT44(in_stack_fffffffffffff0b4,in_stack_fffffffffffff0b0));
          local_b8 = local_b8 + 1;
        }
        if (GA[local_38].corner_flag != 0) {
          alStack_98[local_18] = local_f8[local_18] << 1;
        }
      }
      pnga_free((void *)0x224f0c);
      pnga_free((void *)0x224f19);
      free(local_520);
      free(local_528);
      local_8 = 1;
    }
  }
  return local_8;
}

Assistant:

logical pnga_update44_ghosts(Integer g_a)
{
  Integer idx, idir, i, np, handle=GA_OFFSET + g_a;
  Integer size, buflen, buftot, bufsize, ndim, increment[MAXDIM];
  Integer proc_rem_snd, proc_rem_rcv, pmax;
  Integer msgcnt, length;
  Integer width[MAXDIM], dims[MAXDIM], index[MAXDIM];
  Integer lo_loc[MAXDIM], hi_loc[MAXDIM];
  Integer plo_snd[MAXDIM], phi_snd[MAXDIM];
  Integer lo_rcv[MAXDIM], hi_rcv[MAXDIM];
  Integer slo_rcv[MAXDIM], shi_rcv[MAXDIM];
  Integer plo_rcv[MAXDIM], phi_rcv[MAXDIM];
  Integer ld_loc[MAXDIM];
  int msglen;
  int stride_snd[MAXDIM], stride_rcv[MAXDIM],count[MAXDIM];
  char *ptr_snd, *ptr_rcv;
  char send_name[32], rcv_name[32];
  void *snd_ptr, *rcv_ptr, *snd_ptr_orig, *rcv_ptr_orig;
  Integer me = pnga_nodeid();
  Integer p_handle;
  Integer *_ga_map = NULL;
  Integer *_ga_proclist = NULL;

  /* This routine makes use of the shift algorithm to update data in the
   * ghost cells bounding the local block of visible data. The shift
   * algorithm starts by updating the blocks of data along the first
   * dimension by grabbing a block of data that is width[0] deep but
   * otherwise matches the  dimensions of the data residing on the
   * calling processor. The update of the second dimension, however,
   * grabs a block that is width[1] deep in the second dimension but is
   * ldim0 + 2*width[0] in the first dimensions where ldim0 is the
   * size of the visible data along the first dimension. The remaining
   * dimensions are left the same. For the next update, the width of the
   * second dimension is also increased by 2*width[1] and so on. This
   * algorith makes use of the fact that data for the dimensions that
   * have already been updated is available on each processor and can be
   * used in the updates of subsequent dimensions. The total number of
   * separate updates is 2*ndim, an update in the negative and positive
   * directions for each dimension.
   *
   * This implementation make use of explicit message passing to perform
   * the update. Separate message types for the updates in each coordinate
   * direction are used to maintain synchronization locally and to
   * guarantee that the data is present before the updates in a new
   * coordinate direction take place.
   *
   * To perform the update, this routine makes use of several copies of
   * indices marking the upper and lower limits of data. Indices
   * beginning with the character "p" are relative indices marking the
   * location of the data set relative to the origin the local patch of
   * the global array, all other indices are in absolute coordinates and
   * mark locations in the total global array. The indices used by this
   * routine are described below.
   *
   *       lo_loc[], hi_loc[]: The lower and upper indices of the visible
   *       block of data held by the calling processor.
   *
   *       lo_rcv[], hi_rcv[]: The lower and upper indices of the blocks
   *       of data that will be either sent to or received from a remote
   *       processor. These indices are NOT corrected for wrap-around
   *       (periodic) boundary conditions so they can be negative or greater
   *       than the array dimension values held in dims[].
   *
   *       slo_rcv[], shi_rcv[]: Similar to lo_rcv[] and hi_rcv[], except
   *       that these indices have been corrected for wrap-around
   *       boundary conditions.
   *
   *       plo_rcv[], phi_rcv[]: The local indices of the local data patch
   *       that receive that message from the remote processor.
   *
   *       plo_snd[], phi_snd[]: The local indices of the data patch
   *       that will be sent to the remote processor. Note that the
   *       dimensions of the patches represented by plo_rec[], plo_rec[] and
   *       plo_snd[], phi_snd[] must be the same.
   */

  /* if global array has no ghost cells, just return */
  if (!pnga_has_ghosts(g_a)) return TRUE;

  size = GA[handle].elemsize;
  ndim = GA[handle].ndim;
  p_handle = GA[handle].p_handle;

  /* initialize range increments and get array dimensions */
  for (idx=0; idx < ndim; idx++) {
    increment[idx] = 0;
    width[idx] = (Integer)GA[handle].width[idx];
    dims[idx] = (Integer)GA[handle].dims[idx];
  }

  /* Check to make sure that global array is well-behaved (all processors
     have data and the width of the data in each dimension is greater
     than the corresponding value in width[]. */
  if (!gai_check_ghost_distr(g_a)) return FALSE;

  _ga_map = malloc((GAnproc*2*MAXDIM+1)*sizeof(Integer));
  if(!_ga_map) pnga_error("pnga_update44_ghosts:malloc failed (_ga_map)",0);
  _ga_proclist = malloc(GAnproc*sizeof(Integer));
  if(!_ga_proclist) pnga_error("pnga_update44_ghosts:malloc failed (_ga_proclist)",0);

  msgcnt = 0;

  /* obtain range of data that is held by local processor */
  pnga_distribution(g_a,me,lo_loc,hi_loc);
  /* Get indices of processor in virtual grid */
  pnga_proc_topology(g_a, me, index);

  /* Try to find maximum size of message that will be sent during
   * update operations and use this to allocate memory for message
   * passing buffers. */
  buftot = 1;
  for (i=0; i<ndim; i++) {
    buftot *= (hi_loc[i]-lo_loc[i] + 1 + 2*width[i]);
  }
  buflen = 1;
  for (i = 0; i < ndim; i++) {
    idir =  hi_loc[i] - lo_loc[i] + 1;
    if (buflen < (buftot/(idir + 2*width[i]))*width[i]) {
      buflen = (buftot/(idir + 2*width[i]))*width[i];
    }
  }
  bufsize = size*buflen;
  strcpy(send_name,"send_buffer");
  strcpy(rcv_name,"receive_buffer");
  snd_ptr_orig = snd_ptr = pnga_malloc(buflen, GA[handle].type, send_name);
  rcv_ptr_orig = rcv_ptr = pnga_malloc(buflen, GA[handle].type, rcv_name);

  /* loop over dimensions for sequential update using shift algorithm */
  for (idx=0; idx < ndim; idx++) {

    /* Do not bother with update if nwidth is zero */
    if (width[idx] != 0) {

      /* Perform update in negative direction. */
      get_remote_block_neg(idx, ndim, lo_loc, hi_loc, slo_rcv, shi_rcv,
                           dims, width);
      /* locate processor with this data */
      if (!pnga_locate_region(g_a, slo_rcv, shi_rcv, _ga_map,
          _ga_proclist, &np)) ga_RegionError(pnga_ndim(g_a),
          slo_rcv, shi_rcv, g_a);
      proc_rem_snd = _ga_proclist[0];
      if (p_handle >= 0) {
        proc_rem_snd = PGRP_LIST[p_handle].inv_map_proc_list[proc_rem_snd];
      }

      /* Find processor from which data will be recieved */
      for (i = 0; i < ndim; i++) {
        if (i == idx) {
          lo_rcv[i] = hi_loc[i] + 1;
          hi_rcv[i] = hi_loc[i] + width[i];
        } else {
          lo_rcv[i] = lo_loc[i];
          hi_rcv[i] = hi_loc[i];
        }
      }

      /* Account for boundaries, if necessary. */
      for (i=0; i<ndim; i++) {
        if (i == idx) {
          if (hi_rcv[i] > dims[i]) {
            slo_rcv[i] = 1;
            shi_rcv[i] = width[i];
          } else {
            slo_rcv[i] = lo_rcv[i];
            shi_rcv[i] = hi_rcv[i];
          }
        } else {
          slo_rcv[i] = lo_rcv[i];
          shi_rcv[i] = hi_rcv[i];
        }
      }
      /* locate processor with this data */
      if (!pnga_locate_region(g_a, slo_rcv, shi_rcv, _ga_map,
          _ga_proclist, &np)) ga_RegionError(pnga_ndim(g_a),
          slo_rcv, shi_rcv, g_a);
      proc_rem_rcv = _ga_proclist[0];
      if (p_handle >= 0) {
        proc_rem_rcv = PGRP_LIST[p_handle].inv_map_proc_list[proc_rem_rcv];
      }

      /* Get actual coordinates of chunk of data that will be sent to
       * remote processor as well as coordinates of the array space that
       * will receive data from remote processor. */
      for (i = 0; i < ndim; i++) {
        if (increment[i] == 0) {
          if (i == idx) {
            plo_snd[i] = width[i];
            phi_snd[i] = 2*width[i] - 1;
            plo_rcv[i] = hi_loc[i] - lo_loc[i] + width[i] + 1;
            phi_rcv[i] = hi_loc[i] - lo_loc[i] + 2*width[i];
          } else {
            plo_snd[i] = width[i];
            phi_snd[i] = hi_loc[i] - lo_loc[i] + width[i];
            plo_rcv[i] = width[i];
            phi_rcv[i] = hi_loc[i] - lo_loc[i] + width[i];
          }
        } else {
          plo_rcv[i] = 0;
          phi_rcv[i] = hi_loc[i] - lo_loc[i] + increment[i];
          plo_snd[i] = 0;
          phi_snd[i] = hi_loc[i] - lo_loc[i] + increment[i];
        }
      }

      /* Get pointer to local data buffer and remote data
         buffer as well as lists of leading dimenstions */
      gam_LocationWithGhosts(me, handle, plo_snd, &ptr_snd, ld_loc);
#if GHOST_PRINT
      printf("p[%d] 1: plo_snd[0]: %d plo_snd[1]: %d ptr_snd: %d\n",
          GAme, plo_snd[0], plo_snd[1], (Integer)ptr_snd);
      fflush(stdout);
#endif
      gam_LocationWithGhosts(me, handle, plo_rcv, &ptr_rcv, ld_loc);
#if GHOST_PRINT
      printf("p[%d] 1: plo_rcv[0]: %d plo_rcv[1]: %d ptr_rcv: %d\n",
          GAme, plo_rcv[0], plo_rcv[1], (Integer)ptr_rcv);
      fflush(stdout);
#endif

      /* Evaluate strides for send and recieve */
      gam_setstride(ndim, size, ld_loc, ld_loc, stride_rcv,
          stride_snd);

      /* Compute the number of elements in each dimension and store
         result in count. Scale the first element in count by the
         element size. */
      gam_ComputeCount(ndim, plo_rcv, phi_rcv, count);
      gam_CountElems(ndim, plo_snd, phi_snd, &length);
      length *= size;
      count[0] *= size;

      /* Fill send buffer with data. */
#if GHOST_PRINT
      printf("p[%d]b 1: ptr_snd: %d ptr_rcv: %d\n", GAme, (Integer)ptr_snd,
              (Integer)ptr_rcv);
      printf("p[%d]b 1: length: %d proc_rem_snd: %d proc_rem_rcv: %d\n",
          GAme, (int)length, (int)proc_rem_snd, (int)proc_rem_rcv);
      printf("p[%d]b 1: count[0]: %d stride_rcv[0]: %d stride_rcv[1]: %d\n",
          GAme, count[0], stride_rcv[0],stride_rcv[1]);
      printf("p[%d]b 1: count[1]: %d stride_rcv[2]: %d stride_rcv[3]: %d\n",
          GAme, count[1], stride_rcv[2],stride_rcv[3]);
      printf("p[%d]b 1: count[2]: %d stride_snd[0]: %d stride_snd[1]: %d\n",
          GAme, count[2], stride_snd[0],stride_snd[1]);
      printf("p[%d]b 1: count[3]: %d stride_snd[2]: %d stride_snd[3]: %d\n",
          GAme, count[3], stride_snd[2],stride_snd[3]);
      printf("p[%d]b 1: snd_ptr: %d rcv_ptr: %d\n", GAme, (Integer)snd_ptr,
          (Integer)rcv_ptr);
      fflush(stdout);
#endif
      armci_write_strided(ptr_snd, (int)ndim-1, stride_snd, count, snd_ptr);

      /* Send Messages. If processor has odd index in direction idx, it
       * sends message first, if processor has even index it receives
       * message first. Then process is reversed. Also need to account
       * for whether or not there are an odd number of processors along
       * update direction. */

#if GHOST_PRINT
      printf("p[%d] 1: msgcnt: %d length: %d bufsize: %d proc_rem_snd: %d proc_rem_rcv: %d\n",
          GAme, msgcnt, length, bufsize, (int)proc_rem_snd, (int)proc_rem_rcv);
      fflush(stdout);
#endif
      snd_ptr = snd_ptr_orig;
      rcv_ptr = rcv_ptr_orig;
      if (GAme != proc_rem_snd) {
        if (GA[handle].nblock[idx]%2 == 0) {
          if (index[idx]%2 != 0) {
            armci_msg_snd(msgcnt, snd_ptr, length, proc_rem_snd);
          } else {
            armci_msg_rcv(msgcnt, rcv_ptr, bufsize, &msglen, proc_rem_rcv);
          }
          if (index[idx]%2 != 0) {
            armci_msg_rcv(msgcnt, rcv_ptr, bufsize, &msglen, proc_rem_rcv);
          } else {
            armci_msg_snd(msgcnt, snd_ptr, length, proc_rem_snd);
          }
        } else {
          pmax = GA[handle].nblock[idx] - 1;
          if (index[idx]%2 != 0) {
            armci_msg_snd(msgcnt, snd_ptr, length, proc_rem_snd);
          } else if (index[idx] != pmax) {
            armci_msg_rcv(msgcnt, rcv_ptr, bufsize, &msglen, proc_rem_rcv);
          }
          if (index[idx]%2 != 0) {
            armci_msg_rcv(msgcnt, rcv_ptr, bufsize, &msglen, proc_rem_rcv);
          } else if (index[idx] != 0) {
            armci_msg_snd(msgcnt, snd_ptr, length, proc_rem_snd);
          }
          /* make up for odd processor at end of string */
          if (index[idx] == 0) {
            armci_msg_snd(msgcnt, snd_ptr, length, proc_rem_snd);
          }
          if (index[idx] == pmax) {
            armci_msg_rcv(msgcnt, rcv_ptr, bufsize, &msglen, proc_rem_rcv);
          }
        }
      } else {
        rcv_ptr = snd_ptr;
      }
      msgcnt++;
      /* copy data back into global array */
      armci_read_strided(ptr_rcv, (int)ndim-1, stride_rcv, count, rcv_ptr);

      /* Find parameters for message in positive direction. */
      get_remote_block_pos(idx, ndim, lo_loc, hi_loc, slo_rcv, shi_rcv,
                           dims, width);
      /* locate processor with this data */
      if (!pnga_locate_region(g_a, slo_rcv, shi_rcv, _ga_map,
          _ga_proclist, &np)) ga_RegionError(pnga_ndim(g_a),
          slo_rcv, shi_rcv, g_a);
      proc_rem_snd = _ga_proclist[0];
      if (p_handle >= 0) {
        proc_rem_snd = PGRP_LIST[p_handle].inv_map_proc_list[proc_rem_snd];
      }

      /* Find processor from which data will be recieved */
      for (i = 0; i < ndim; i++) {
        if (i == idx) {
          lo_rcv[i] = lo_loc[i] - width[i];
          hi_rcv[i] = lo_loc[i] - 1;
        } else {
          lo_rcv[i] = lo_loc[i];
          hi_rcv[i] = hi_loc[i];
        }
      }

      /* Account for boundaries, if necessary. */
      for (i=0; i<ndim; i++) {
        if (i == idx) {
          if (hi_rcv[i] < 1) {
            slo_rcv[i] = dims[i] - width[i] + 1;
            shi_rcv[i] = dims[i];
          } else {
            slo_rcv[i] = lo_rcv[i];
            shi_rcv[i] = hi_rcv[i];
          }
        } else {
          slo_rcv[i] = lo_rcv[i];
          shi_rcv[i] = hi_rcv[i];
        }
      }
      /* locate processor with this data */
      if (!pnga_locate_region(g_a, slo_rcv, shi_rcv, _ga_map,
          _ga_proclist, &np)) ga_RegionError(pnga_ndim(g_a),
          slo_rcv, shi_rcv, g_a);
      proc_rem_rcv = _ga_proclist[0];
      if (p_handle >= 0) {
        proc_rem_rcv = PGRP_LIST[p_handle].inv_map_proc_list[proc_rem_rcv];
      }
      /* Get actual coordinates of chunk of data that will be sent to
       * remote processor as well as coordinates of the array space that
       * will receive data from remote processor. */
      for (i = 0; i < ndim; i++) {
        if (increment[i] == 0) {
          if (i == idx) {
            plo_snd[i] = hi_loc[i] - lo_loc[i] + 1;
            phi_snd[i] = hi_loc[i] - lo_loc[i] + width[i];
            plo_rcv[i] = 0;
            phi_rcv[i] = width[i] - 1;
          } else {
            plo_snd[i] = width[i];
            phi_snd[i] = hi_loc[i] - lo_loc[i] + width[i];
            plo_rcv[i] = width[i];
            phi_rcv[i] = hi_loc[i] - lo_loc[i] + width[i];
          }
        } else {
          plo_rcv[i] = 0;
          phi_rcv[i] = hi_loc[i] - lo_loc[i] + increment[i];
          plo_snd[i] = 0;
          phi_snd[i] = hi_loc[i] - lo_loc[i] + increment[i];
        }
      }

      /* Get pointer to local data buffer and remote data
         buffer as well as lists of leading dimenstions */
      gam_LocationWithGhosts(me, handle, plo_snd, &ptr_snd, ld_loc);
#if GHOST_PRINT
      printf("p[%d] 2: plo_snd[0]: %d plo_snd[1]: %d ptr_snd: %d\n",
          GAme, plo_snd[0], plo_snd[1], (Integer)ptr_snd);
      fflush(stdout);
#endif
      gam_LocationWithGhosts(me, handle, plo_rcv, &ptr_rcv, ld_loc);
#if GHOST_PRINT
      printf("p[%d] 2: plo_rcv[0]: %d plo_rcv[1]: %d ptr_rcv: %d\n",
          GAme, plo_rcv[0], plo_rcv[1], (Integer)ptr_rcv);
      fflush(stdout);
#endif

      /* Evaluate strides for send and recieve */
      gam_setstride(ndim, size, ld_loc, ld_loc, stride_rcv,
          stride_snd);

      /* Compute the number of elements in each dimension and store
         result in count. Scale the first element in count by the
         element size. */
      gam_ComputeCount(ndim, plo_rcv, phi_rcv, count);
      gam_CountElems(ndim, plo_snd, phi_snd, &length);
      length *= size;
      count[0] *= size;

      /* Need to reallocate memory if length > buflen */
      /* TO DO */

      /* Fill send buffer with data. */
#if GHOST_PRINT
      printf("p[%d]b 2: ptr_snd: %d ptr_rcv: %d\n", GAme, (Integer)ptr_snd,
              (Integer)ptr_rcv);
      printf("p[%d]b 2: length: %d proc_rem_snd: %d proc_rem_rcv: %d\n",
          GAme, (int)length, (int)proc_rem_snd, (int)proc_rem_rcv);
      printf("p[%d]b 2: count[0]: %d stride_rcv[0]: %d stride_rcv[1]: %d\n",
          GAme, count[0], stride_rcv[0],stride_rcv[1]);
      printf("p[%d]b 2: count[1]: %d stride_rcv[2]: %d stride_rcv[3]: %d\n",
          GAme, count[1], stride_rcv[2],stride_rcv[3]);
      printf("p[%d]b 2: count[2]: %d stride_snd[0]: %d stride_snd[1]: %d\n",
          GAme, count[2], stride_snd[0],stride_snd[1]);
      printf("p[%d]b 2: count[3]: %d stride_snd[2]: %d stride_snd[3]: %d\n",
          GAme, count[3], stride_snd[2],stride_snd[3]);
      printf("p[%d]b 2: snd_ptr: %d rcv_ptr: %d\n", GAme, (Integer)snd_ptr,
          (Integer)rcv_ptr);
      fflush(stdout);
#endif
      armci_write_strided(ptr_snd, (int)ndim-1, stride_snd, count, snd_ptr);

      /* Send Messages. If processor has odd index in direction idx, it
       * sends message first, if processor has even index it receives
       * message first. Then process is reversed. Also need to account
       * for whether or not there are an odd number of processors along
       * update direction. */

#if GHOST_PRINT
      printf("p[%d] 2: msgcnt: %d length: %d bufsize: %d proc_rem_snd: %d proc_rem_rcv: %d\n",
          GAme, msgcnt, length, bufsize, (int)proc_rem_snd, (int)proc_rem_rcv);
      fflush(stdout);
#endif
      snd_ptr = snd_ptr_orig;
      rcv_ptr = rcv_ptr_orig;
      if (GAme != proc_rem_rcv) {
        if (GA[handle].nblock[idx]%2 == 0) {
          if (index[idx]%2 != 0) {
            armci_msg_snd(msgcnt, snd_ptr, length, proc_rem_snd);
          } else {
            armci_msg_rcv(msgcnt, rcv_ptr, bufsize, &msglen, proc_rem_rcv);
          }
          if (index[idx]%2 != 0) {
            armci_msg_rcv(msgcnt, rcv_ptr, bufsize, &msglen, proc_rem_rcv);
          } else {
            armci_msg_snd(msgcnt, snd_ptr, length, proc_rem_snd);
          }
        } else {
          pmax = GA[handle].nblock[idx] - 1;
          if (index[idx]%2 != 0) {
            armci_msg_snd(msgcnt, snd_ptr, length, proc_rem_snd);
          } else if (index[idx] != 0) {
            armci_msg_rcv(msgcnt, rcv_ptr, bufsize, &msglen, proc_rem_rcv);
          }
          if (index[idx]%2 != 0) {
            armci_msg_rcv(msgcnt, rcv_ptr, bufsize, &msglen, proc_rem_rcv);
          } else if (index[idx] != pmax) {
            armci_msg_snd(msgcnt, snd_ptr, length, proc_rem_snd);
          }
          /* make up for odd processor at end of string */
          if (index[idx] == pmax) {
            armci_msg_snd(msgcnt, snd_ptr, length, proc_rem_snd);
          }
          if (index[idx] == 0) {
            armci_msg_rcv(msgcnt, rcv_ptr, bufsize, &msglen, proc_rem_rcv);
          }
        }
      } else {
        rcv_ptr = snd_ptr;
      }
      /* copy data back into global array */
      armci_read_strided(ptr_rcv, (int)ndim-1, stride_rcv, count, rcv_ptr);
      msgcnt++;
    }
    if (GA[handle].corner_flag)
      increment[idx] = 2*width[idx];
  }

  pnga_free(rcv_ptr_orig);
  pnga_free(snd_ptr_orig);
  free(_ga_map);
  free(_ga_proclist);
  return TRUE;
}